

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

DynamicObject * __thiscall Js::DynamicObject::Copy(DynamicObject *this,bool deepCopy)

{
  DynamicTypeHandler *this_00;
  Recycler *pRVar1;
  DynamicObject *pDVar2;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  size_t local_28;
  size_t inlineSlotsSize;
  DynamicObject *pDStack_18;
  bool deepCopy_local;
  DynamicObject *this_local;
  
  inlineSlotsSize._7_1_ = deepCopy;
  pDStack_18 = this;
  this_00 = GetTypeHandler(this);
  local_28 = DynamicTypeHandler::GetInlineSlotsSize(this_00);
  if (local_28 == 0) {
    pRVar1 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
               ,0x411);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_88);
    pDVar2 = (DynamicObject *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
    DynamicObject(pDVar2,this,(bool)(inlineSlotsSize._7_1_ & 1));
    this_local = pDVar2;
  }
  else {
    pRVar1 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&typeinfo,local_28,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
               ,0x40d);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
    local_60 = Memory::Recycler::AllocZero;
    local_58 = 0;
    pDVar2 = (DynamicObject *)new<Memory::Recycler>(0x20,pRVar1,0x473830,0);
    DynamicObject(pDVar2,this,(bool)(inlineSlotsSize._7_1_ & 1));
    this_local = pDVar2;
  }
  return this_local;
}

Assistant:

DynamicObject *
    DynamicObject::Copy(bool deepCopy)
    {
        size_t inlineSlotsSize = this->GetTypeHandler()->GetInlineSlotsSize();
        if (inlineSlotsSize)
        {
            return RecyclerNewPlusZ(GetRecycler(), inlineSlotsSize, DynamicObject, this, deepCopy);
        }
        else
        {
            return RecyclerNew(GetRecycler(), DynamicObject, this, deepCopy);
        }
    }